

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O3

bool __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>::
prune(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true> *this)

{
  bool bVar1;
  EBPlane *pEVar2;
  int iVar3;
  int iVar4;
  int dim;
  long lVar5;
  double dVar6;
  double dVar7;
  double dStack_28;
  GpuArray<double,_3U> mid;
  
  iVar4 = this->psiCount;
  if (0 < iVar4) {
    iVar3 = 0;
    do {
      mid.arr[0] = 0.0;
      mid.arr[1] = 0.0;
      pEVar2 = this->phi;
      lVar5 = 0;
      dVar6 = 0.0;
      do {
        if ((this->free).arr[lVar5] == true) {
          dVar6 = dVar6 + ABS((pEVar2->norm).arr[lVar5]);
        }
        else {
          mid.arr[lVar5 + -1] =
               *(double *)
                (&DAT_00756ed0 +
                (ulong)(((this->psi).arr[iVar3].bits >> ((uint)lVar5 & 0x1f) & 1) == 0) * 8);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      dVar7 = (mid.arr[1] - (pEVar2->cent).arr[2]) * (pEVar2->norm).arr[2] +
              (0.0 - (pEVar2->cent).arr[0]) * (pEVar2->norm).arr[0] +
              (mid.arr[0] - (pEVar2->cent).arr[1]) * (pEVar2->norm).arr[1];
      if ((dVar6 * 0.4999999999999989 < dVar7) || (dVar7 < -(dVar6 * 0.4999999999999989))) {
        if (((dVar7 < 0.0) || (((this->psi).arr[iVar3].bits & 0x18) == 0)) &&
           ((0.0 < dVar7 || (((this->psi).arr[iVar3].bits & 0x18) == 0x10)))) {
          return false;
        }
        this->psiCount = iVar4 + -1;
        bVar1 = (bool)(this->psi).arr[iVar3].bits;
        (this->psi).arr[iVar3].bits = (this->free).arr[(long)iVar4 + 2];
        (this->free).arr[(long)iVar4 + 2] = bVar1;
        iVar4 = this->psiCount;
      }
      else {
        iVar3 = iVar3 + 1;
      }
    } while (iVar3 < iVar4);
  }
  return true;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool prune () noexcept
    {
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        static constexpr Real almostone = 1.0-10.*eps;

        for (int i = 0; i < psiCount; )
        {
            GpuArray<Real,N> mid = xrange.midpoint();
            Real dphi_max = 0.0_rt;
            for (int dim = 0; dim < N; ++dim) {
                if (free[dim]) {
                    dphi_max += amrex::Math::abs(phi.grad(dim));
                } else {
                    mid[dim] = xrange(psi[i].side(dim),dim);
                }
            }
            dphi_max *= 0.5*almostone;
            const Real phi_0 = phi(mid);
            bool uniform_sign = (phi_0 > dphi_max) || (phi_0 < -dphi_max);
            if (uniform_sign)
            {
                if ((phi_0 >= 0.0 && psi[i].sign() >= 0) ||
                    (phi_0 <= 0.0 && psi[i].sign() <= 0) )
                {
                    --psiCount;
                    detail::swap(psi[i], psi[psiCount]);
                }
                else {
                    return false;
                }
            }
            else {
                ++i;
            }
        }
        return true;
    }